

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Torsion.cpp
# Opt level: O2

void __thiscall OpenMD::Torsion::calcForce(Torsion *this,RealType *angle,bool doParticlePot)

{
  Atom *pAVar1;
  RealType *particlePot;
  Vector<double,_3U> *v1;
  double dVar2;
  double dVar3;
  double dVar4;
  RealType dVdcosPhi;
  Vector3d r32;
  Vector3d f1;
  Vector3d A;
  Vector3d r43;
  Vector3d dcosdB;
  Vector3d f3;
  Vector3d f2;
  Vector3d B;
  Vector3d r21;
  Vector3d dcosdA;
  Vector3d pos4;
  Vector3d pos3;
  Vector3d pos2;
  Vector3d pos1;
  Vector<double,_3U> local_200;
  Vector<double,_3U> local_1e8;
  RealType *local_1d0;
  double local_1c8;
  RealType *local_1c0;
  double local_1b8;
  Vector<double,_3U> local_1b0;
  Vector<double,_3U> local_198;
  Vector<double,_3U> local_180;
  Vector<double,_3U> local_168;
  Vector<double,_3U> local_150;
  Vector<double,_3U> local_138;
  Vector<double,_3U> local_120;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_1c0 = angle;
  StuntDouble::getPos((Vector3d *)&local_48,
                      &(*(this->super_ShortRangeInteraction).atoms_.
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start)->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_60,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[1]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_78,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[2]->super_StuntDouble);
  StuntDouble::getPos((Vector3d *)&local_90,
                      &(this->super_ShortRangeInteraction).atoms_.
                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                       super__Vector_impl_data._M_start[3]->super_StuntDouble);
  operator-(&local_1b0,&local_48,&local_60);
  Vector<double,_3U>::Vector(&local_d8,&local_1b0);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_d8);
  operator-(&local_168,&local_60,&local_78);
  Vector<double,_3U>::Vector(&local_1b0,&local_168);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_1b0);
  operator-(&local_180,&local_78,&local_90);
  Vector<double,_3U>::Vector(&local_168,&local_180);
  Snapshot::wrapVector
            (((this->super_ShortRangeInteraction).snapshotMan_)->currentSnapshot_,
             (Vector3d *)&local_168);
  cross<double>((Vector3<double> *)&local_180,(Vector3<double> *)&local_d8,
                (Vector3<double> *)&local_1b0);
  dVar2 = Vector<double,_3U>::length(&local_180);
  cross<double>((Vector3<double> *)&local_f0,(Vector3<double> *)&local_1b0,
                (Vector3<double> *)&local_168);
  local_1c8 = Vector<double,_3U>::length(&local_f0);
  if (1e-06 <= dVar2 * local_1c8) {
    Vector<double,_3U>::normalize(&local_180);
    Vector<double,_3U>::normalize(&local_f0);
    dVar3 = dot<double,3u>(&local_180,&local_f0);
    dVar4 = 1.0;
    if (dVar3 <= 1.0) {
      dVar4 = dVar3;
    }
    dVar3 = -1.0;
    if (-1.0 <= dVar4) {
      dVar3 = dVar4;
    }
    local_1d0 = &this->potential_;
    (*this->torsionType_->_vptr_TorsionType[2])(this->torsionType_,local_1d0,&local_1b8);
    Vector<double,_3U>::Vector(&local_198);
    Vector<double,_3U>::Vector(&local_108);
    Vector<double,_3U>::Vector(&local_120);
    operator*(&local_200,dVar3,&local_180);
    operator-(&local_1e8,&local_200,&local_f0);
    operator/(&local_138,&local_1e8,dVar2);
    Vector<double,_3U>::Vector(&local_a8,&local_138);
    operator*(&local_150,dVar3,&local_f0);
    operator-(&local_200,&local_150,&local_180);
    operator/(&local_1e8,&local_200,local_1c8);
    Vector<double,_3U>::Vector(&local_138,&local_1e8);
    dVar2 = local_1b8;
    cross<double>((Vector3<double> *)&local_200,(Vector3<double> *)&local_1b0,
                  (Vector3<double> *)&local_a8);
    operator*(&local_1e8,dVar2,&local_200);
    Vector3<double>::operator=((Vector3<double> *)&local_198,&local_1e8);
    dVar2 = local_1b8;
    cross<double>((Vector3<double> *)&local_150,(Vector3<double> *)&local_168,
                  (Vector3<double> *)&local_138);
    cross<double>((Vector3<double> *)&local_c0,(Vector3<double> *)&local_d8,
                  (Vector3<double> *)&local_a8);
    operator-(&local_200,&local_150,&local_c0);
    operator*(&local_1e8,dVar2,&local_200);
    Vector3<double>::operator=((Vector3<double> *)&local_108,&local_1e8);
    cross<double>((Vector3<double> *)&local_200,(Vector3<double> *)&local_138,
                  (Vector3<double> *)&local_1b0);
    operator*(&local_1e8,local_1b8,&local_200);
    Vector3<double>::operator=((Vector3<double> *)&local_120,&local_1e8);
    StuntDouble::addFrc(&(*(this->super_ShortRangeInteraction).atoms_.
                           super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                           _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble,
                        (Vector3d *)&local_198);
    pAVar1 = (this->super_ShortRangeInteraction).atoms_.
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start[1];
    operator-(&local_200,&local_108,&local_198);
    Vector<double,_3U>::Vector(&local_1e8,&local_200);
    StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1e8);
    pAVar1 = (this->super_ShortRangeInteraction).atoms_.
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start[2];
    operator-(&local_200,&local_120,&local_108);
    Vector<double,_3U>::Vector(&local_1e8,&local_200);
    StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1e8);
    pAVar1 = (this->super_ShortRangeInteraction).atoms_.
             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
             super__Vector_impl_data._M_start[3];
    operator-(&local_200,(OpenMD *)&local_120,v1);
    Vector<double,_3U>::Vector(&local_1e8,&local_200);
    StuntDouble::addFrc(&pAVar1->super_StuntDouble,(Vector3d *)&local_1e8);
    particlePot = local_1d0;
    if (doParticlePot) {
      StuntDouble::addParticlePot
                (&(*(this->super_ShortRangeInteraction).atoms_.
                    super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                    super__Vector_impl_data._M_start)->super_StuntDouble,local_1d0);
      StuntDouble::addParticlePot
                (&(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start[1]->super_StuntDouble,particlePot);
      StuntDouble::addParticlePot
                (&(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start[2]->super_StuntDouble,particlePot);
      StuntDouble::addParticlePot
                (&(this->super_ShortRangeInteraction).atoms_.
                  super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                  super__Vector_impl_data._M_start[3]->super_StuntDouble,particlePot);
    }
    dVar2 = acos(dVar3);
    *local_1c0 = (dVar2 / 3.141592653589793) * 180.0;
  }
  return;
}

Assistant:

void Torsion::calcForce(RealType& angle, bool doParticlePot) {
    Vector3d pos1 = atoms_[0]->getPos();
    Vector3d pos2 = atoms_[1]->getPos();
    Vector3d pos3 = atoms_[2]->getPos();
    Vector3d pos4 = atoms_[3]->getPos();

    Vector3d r21 = pos1 - pos2;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r21);
    Vector3d r32 = pos2 - pos3;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r32);
    Vector3d r43 = pos3 - pos4;
    snapshotMan_->getCurrentSnapshot()->wrapVector(r43);

    //  Calculate the cross products and distances
    Vector3d A  = cross(r21, r32);
    RealType rA = A.length();
    Vector3d B  = cross(r32, r43);
    RealType rB = B.length();

    /*
     If either of the two cross product vectors is tiny, that means
     the three atoms involved are colinear, and the torsion angle is
     going to be undefined.  The easiest check for this problem is
     to use the product of the two lengths.
  */
    if (rA * rB < OpenMD::epsilon) return;

    A.normalize();
    B.normalize();

    //  Calculate the sin and cos
    RealType cos_phi = dot(A, B);
    if (cos_phi > 1.0) cos_phi = 1.0;
    if (cos_phi < -1.0) cos_phi = -1.0;

    RealType dVdcosPhi;
    torsionType_->calcForce(cos_phi, potential_, dVdcosPhi);
    Vector3d f1;
    Vector3d f2;
    Vector3d f3;

    Vector3d dcosdA = (cos_phi * A - B) / rA;
    Vector3d dcosdB = (cos_phi * B - A) / rB;

    f1 = dVdcosPhi * cross(r32, dcosdA);
    f2 = dVdcosPhi * (cross(r43, dcosdB) - cross(r21, dcosdA));
    f3 = dVdcosPhi * cross(dcosdB, r32);

    atoms_[0]->addFrc(f1);
    atoms_[1]->addFrc(f2 - f1);
    atoms_[2]->addFrc(f3 - f2);
    atoms_[3]->addFrc(-f3);

    if (doParticlePot) {
      atoms_[0]->addParticlePot(potential_);
      atoms_[1]->addParticlePot(potential_);
      atoms_[2]->addParticlePot(potential_);
      atoms_[3]->addParticlePot(potential_);
    }

    angle = acos(cos_phi) / Constants::PI * 180.0;
  }